

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O2

string * Catch::StringMaker<std::basic_string_view<wchar_t,std::char_traits<wchar_t>>,void>::
         convert_abi_cxx11_(wstring_view str)

{
  string *in_RDI;
  allocator<wchar_t> local_41;
  wstring local_40;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> local_20;
  
  std::__cxx11::wstring::wstring<std::basic_string_view<wchar_t,std::char_traits<wchar_t>>,void>
            ((wstring *)&local_40,&local_20,&local_41);
  StringMaker<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_void>
  ::convert(in_RDI,&local_40);
  std::__cxx11::wstring::~wstring((wstring *)&local_40);
  return in_RDI;
}

Assistant:

std::string StringMaker<std::wstring_view>::convert(std::wstring_view str) {
    return StringMaker<std::wstring>::convert(std::wstring(str));
}